

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assert.h
# Opt level: O2

void __thiscall
xtest::AssertFail::AssertFail(AssertFail *this,char *case_name,char *msg,char *file_path,uint line)

{
  ostream *poVar1;
  char *pcVar2;
  string local_1d8 [32];
  stringstream ss;
  ostream local_1a8 [376];
  
  *(undefined ***)this = &PTR__AssertFail_00106d60;
  (this->m_message)._M_dataplus._M_p = (pointer)&(this->m_message).field_2;
  (this->m_message)._M_string_length = 0;
  (this->m_message).field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = std::operator<<(local_1a8,"[ASSERT]");
  poVar1 = std::operator<<(poVar1,'\"');
  pcVar2 = getFileName(this,file_path);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"\" line ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," in \"");
  poVar1 = std::operator<<(poVar1,case_name);
  poVar1 = std::operator<<(poVar1,"\": ");
  std::operator<<(poVar1,msg);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->m_message,local_1d8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return;
}

Assistant:

AssertFail(const char *case_name,const char *msg,const char *file_path,unsigned int line){
            std::stringstream ss;
            ss << "[ASSERT]"
               << '\"'
               #if XTEST_OUTPUT_FULL_PATH
               << file_path
               #else
               << getFileName(file_path)
               #endif
               << "\" line "
               << line
               << " in \""
               << case_name
               << "\": "
               << msg;
            m_message = ss.str();
        }